

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall
ProblemTest_MutVariable_Test::~ProblemTest_MutVariable_Test(ProblemTest_MutVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ProblemTest, MutVariable) {
  Problem p;
  p.AddVar(0, 1);
  Problem::MutVariable var = p.var(0);
  EXPECT_EQ(0, var.value());
  var.set_value(4.2);
  EXPECT_EQ(4.2, var.value());
  const Problem &cp = p;
  Problem::Variable cvar = cp.var(0);
  cvar = var;
}